

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeXMLParser.cpp
# Opt level: O0

char xe::xml::getEntityValue(string *entity)

{
  bool bVar1;
  int local_1c;
  int ndx;
  string *entity_local;
  
  local_1c = 0;
  while( true ) {
    if (4 < local_1c) {
      return '\0';
    }
    bVar1 = std::operator==(entity,getEntityValue::s_entities[local_1c].name);
    if (bVar1) break;
    local_1c = local_1c + 1;
  }
  return getEntityValue::s_entities[local_1c].value;
}

Assistant:

static char getEntityValue (const std::string& entity)
{
	static const struct
	{
		const char*		name;
		char			value;
	} s_entities[] =
	{
			{ "&lt;",			'<' },
			{ "&gt;",			'>' },
			{ "&amp;",			'&' },
			{ "&apos;",			'\''},
			{ "&quot;",			'"' },
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_entities); ndx++)
	{
		if (entity == s_entities[ndx].name)
			return s_entities[ndx].value;
	}

	return 0;
}